

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

programInfo * __thiscall
gl4cts::GPUShaderFP64Test3::getProgramInfo
          (GPUShaderFP64Test3 *this,uniformDataLayout uniform_data_layout)

{
  return &this->m_packed_program + uniform_data_layout;
}

Assistant:

const GPUShaderFP64Test3::programInfo& GPUShaderFP64Test3::getProgramInfo(uniformDataLayout uniform_data_layout) const
{
	const programInfo* program_info = 0;

	switch (uniform_data_layout)
	{
	case PACKED:

		program_info = &m_packed_program;

		break;

	case SHARED:

		program_info = &m_shared_program;

		break;

	case STD140:

		program_info = &m_std140_program;

		break;
	}

	return *program_info;
}